

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNew
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayNew *curr)

{
  Type local_40 [2];
  uintptr_t local_30;
  
  if (curr->init != (Expression *)0x0) {
    local_30 = (uintptr_t)
               wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).
                           super_Expression.type);
    HeapType::getArray((HeapType *)local_40);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->init,local_40[0]);
  }
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->size,(Type)0x2);
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    if (!curr->isWithDefault()) {
      note(&curr->init, curr->type.getHeapType().getArray().element.type);
    }
    note(&curr->size, Type::i32);
  }